

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O2

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,size_t count,uint32_t intensity)

{
  bool bVar1;
  
  this->m_format = ArrayFormat;
  this->m_affinity = -1;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::reserve(&this->m_data,count);
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    add(this,-1,intensity);
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(size_t count, uint32_t intensity)
{
    m_data.reserve(count);

    for (size_t i = 0; i < count; ++i) {
        add(-1, intensity);
    }
}